

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Group_Type.cxx
# Opt level: O1

void ungroup_cb(Fl_Widget *param_1,void *param_2)

{
  uint uVar1;
  int iVar2;
  undefined4 extraout_var;
  Fl_Type *pFVar3;
  Fl_Type *g;
  char *pcVar4;
  undefined4 extraout_var_00;
  
  g = (Fl_Type *)0x0;
  pcVar4 = (char *)param_2;
  for (pFVar3 = Fl_Type::current; pFVar3 != (Fl_Type *)0x0; pFVar3 = pFVar3->parent) {
    iVar2 = (*pFVar3->_vptr_Fl_Type[0x17])(pFVar3);
    if ((iVar2 != 0) && (iVar2 = (*pFVar3->_vptr_Fl_Type[0x1e])(pFVar3), iVar2 == 0)) {
      g = pFVar3->parent;
      break;
    }
  }
  if ((g != (Fl_Type *)0x0) && (0 < g->level)) {
    if (g->level == 1) {
      iVar2 = (*g->_vptr_Fl_Type[5])(g);
      pcVar4 = "widget_class";
      iVar2 = strcmp((char *)CONCAT44(extraout_var,iVar2),"widget_class");
      if (iVar2 == 0) goto LAB_0017cede;
    }
    pFVar3 = g->next;
    if (pFVar3 != (Fl_Type *)0x0) {
      do {
        uVar1 = pFVar3->level;
        pcVar4 = (char *)(ulong)uVar1;
        if ((int)uVar1 <= g->level) break;
        if ((uVar1 == g->level + 1U) && (pFVar3->selected == '\0')) {
          pcVar4 = "Please select all widgets in group";
          goto LAB_0017cee5;
        }
        pFVar3 = pFVar3->next;
      } while (pFVar3 != (Fl_Type *)0x0);
    }
    pFVar3 = g->next;
    while ((pFVar3 != (Fl_Type *)0x0 && (g->level < pFVar3->level))) {
      iVar2 = Fl_Type::remove(pFVar3,pcVar4);
      pcVar4 = (char *)g;
      Fl_Type::insert(pFVar3,g);
      pFVar3 = (Fl_Type *)CONCAT44(extraout_var_00,iVar2);
    }
    (*g->_vptr_Fl_Type[2])(g);
    return;
  }
LAB_0017cede:
  pcVar4 = "Please select widgets in a group";
LAB_0017cee5:
  fl_message(pcVar4);
  return;
}

Assistant:

void ungroup_cb(Fl_Widget *, void *) {
  // Find the group:
  Fl_Type *q = Fl_Type::current;
  while (q && (!q->is_widget() || q->is_menu_item())) q = q->parent;
  if (q) q = q->parent;
  if (!q || q->level < 1 || (q->level == 1 && !strcmp(q->type_name(), "widget_class"))) {
    fl_message("Please select widgets in a group");
    return;
  }
  Fl_Type* n;
  for (n = q->next; n && n->level > q->level; n = n->next) {
    if (n->level == q->level+1 && !n->selected) {
      fl_message("Please select all widgets in group");
      return;
    }
  }
  for (n = q->next; n && n->level > q->level;) {
    Fl_Type *nxt = n->remove();
    n->insert(q);
    n = nxt;
  }
  delete q;
}